

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadCommand.cxx
# Opt level: O2

cmCTestGenericHandler * __thiscall
cmCTestUploadCommand::InitializeHandler(cmCTestUploadCommand *this)

{
  cmCTestUploadHandler *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (cmCTestUploadHandler *)
            cmCTest::GetInitializedHandler
                      ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"upload");
  if (this_00 == (cmCTestUploadHandler *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_38,"internal CTest error. Cannot instantiate upload handler",
               &local_39);
    cmCommand::SetError((cmCommand *)this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    cmCTestUploadHandler::SetFiles(this_00,&this->Files);
    (this_00->super_cmCTestGenericHandler).Quiet = (this->super_cmCTestHandlerCommand).Quiet;
  }
  return &this_00->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestUploadCommand::InitializeHandler()
{
  cmCTestGenericHandler* handler =
    this->CTest->GetInitializedHandler("upload");
  if (!handler) {
    this->SetError("internal CTest error. Cannot instantiate upload handler");
    return CM_NULLPTR;
  }
  static_cast<cmCTestUploadHandler*>(handler)->SetFiles(this->Files);

  handler->SetQuiet(this->Quiet);
  return handler;
}